

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuVfsClose(sqlite3_file *pFile)

{
  int iVar1;
  int local_20;
  int i;
  int rc;
  rbu_file *p;
  sqlite3_file *pFile_local;
  
  for (local_20 = 0; local_20 < *(int *)((long)&pFile[6].pMethods + 4); local_20 = local_20 + 1) {
    sqlite3_free(*(void **)(&(pFile[7].pMethods)->iVersion + (long)local_20 * 2));
  }
  sqlite3_free(pFile[7].pMethods);
  pFile[7].pMethods = (sqlite3_io_methods *)0x0;
  sqlite3_free(pFile[8].pMethods);
  if (((ulong)pFile[5].pMethods & 0x100) == 0) {
    if ((((ulong)pFile[5].pMethods & 8) != 0) && (pFile[3].pMethods != (sqlite3_io_methods *)0x0)) {
      rbuUpdateTempSize((rbu_file *)pFile,0);
    }
  }
  else {
    rbuMainlistRemove((rbu_file *)pFile);
    rbuUnlockShm((rbu_file *)pFile);
    (**(code **)(*(long *)pFile[1].pMethods + 0x80))(pFile[1].pMethods,0);
  }
  iVar1 = (**(code **)(*(long *)pFile[1].pMethods + 8))(pFile[1].pMethods);
  return iVar1;
}

Assistant:

static int rbuVfsClose(sqlite3_file *pFile){
  rbu_file *p = (rbu_file*)pFile;
  int rc;
  int i;

  /* Free the contents of the apShm[] array. And the array itself. */
  for(i=0; i<p->nShm; i++){
    sqlite3_free(p->apShm[i]);
  }
  sqlite3_free(p->apShm);
  p->apShm = 0;
  sqlite3_free(p->zDel);

  if( p->openFlags & SQLITE_OPEN_MAIN_DB ){
    rbuMainlistRemove(p);
    rbuUnlockShm(p);
    p->pReal->pMethods->xShmUnmap(p->pReal, 0);
  }
  else if( (p->openFlags & SQLITE_OPEN_DELETEONCLOSE) && p->pRbu ){
    rbuUpdateTempSize(p, 0);
  }
  assert( p->pMainNext==0 && p->pRbuVfs->pMain!=p );

  /* Close the underlying file handle */
  rc = p->pReal->pMethods->xClose(p->pReal);
  return rc;
}